

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_packushb_mips64(uint64_t fs,uint64_t ft)

{
  uint64_t uVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  
  bVar2 = 0;
  uVar1 = 0;
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
    uVar4 = (uint)(short)(fs >> ((byte)lVar3 & 0x3f));
    if (0xfe < (int)uVar4) {
      uVar4 = 0xff;
    }
    uVar1 = uVar1 | (ulong)(uVar4 & 0xff) << (bVar2 & 0x3f);
    bVar2 = bVar2 + 8;
  }
  bVar2 = 0;
  for (lVar3 = 0x20; lVar3 != 0x40; lVar3 = lVar3 + 8) {
    uVar4 = (uint)(short)(ft >> (bVar2 & 0x3f));
    if (0xfe < (int)uVar4) {
      uVar4 = 0xff;
    }
    uVar1 = uVar1 | (ulong)(uVar4 & 0xff) << ((byte)lVar3 & 0x3f);
    bVar2 = bVar2 + 0x10;
  }
  return uVar1;
}

Assistant:

uint64_t helper_packushb(uint64_t fs, uint64_t ft)
{
    uint64_t fd = 0;
    unsigned int i;

    for (i = 0; i < 4; ++i) {
        int16_t tmp = fs >> (i * 16);
        tmp = SATUB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8);
    }
    for (i = 0; i < 4; ++i) {
        int16_t tmp = ft >> (i * 16);
        tmp = SATUB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8 + 32);
    }

    return fd;
}